

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O3

void __thiscall
Diligent::FixedLinearAllocator::AddSpace(FixedLinearAllocator *this,size_t size,size_t alignment)

{
  ulong uVar1;
  char (*in_R8) [23];
  size_t sVar2;
  string msg;
  string local_60;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  
  local_38 = alignment;
  local_30 = size;
  if (this->m_pDataStart != (uint8_t *)0x0) {
    FormatString<char[46]>(&local_60,(char (*) [46])"Memory has already been allocated or assigned")
    ;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x95);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = alignment - (alignment >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = ((uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar1 >> 0x38 != 1) {
    FormatString<char[33]>(&local_60,(char (*) [33])"Alignment is not a power of two!");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"AddSpace",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
               ,0x96);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if (size != 0) {
    sVar2 = this->m_CurrAlignment;
    if ((sVar2 == 0) && (sVar2 = 8, this->m_ReservedSize != 0)) {
      FormatString<char[60]>
                (&local_60,
                 (char (*) [60])"This is expected to be a very first time the space is added");
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"AddSpace",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/FixedLinearAllocator.hpp"
                 ,0x9d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    if (sVar2 <= alignment && alignment - sVar2 != 0) {
      this->m_ReservedSize = this->m_ReservedSize + (alignment - sVar2);
    }
    this->m_CurrAlignment = alignment;
    local_40 = alignment;
    if ((char)(uVar1 >> 0x38) != '\x01') {
      FormatString<char[12],unsigned_long,char[23]>
                (&local_60,(Diligent *)"Alignment (",(char (*) [12])&local_40,
                 (unsigned_long *)") must be a power of 2",in_R8);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    local_30 = -local_40 & (size + local_40) - 1;
    this->m_ReservedSize = this->m_ReservedSize + local_30;
    std::
    vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
    ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long&>
              ((vector<Diligent::FixedLinearAllocator::DbgAllocationInfo,std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>>
                *)&this->m_DbgAllocations,&local_30,&local_38,&this->m_ReservedSize);
  }
  return;
}

Assistant:

void AddSpace(size_t size, size_t alignment = 1) noexcept
    {
        VERIFY(m_pDataStart == nullptr, "Memory has already been allocated or assigned");
        VERIFY(IsPowerOfTwo(alignment), "Alignment is not a power of two!");

        if (size == 0)
            return;

        if (m_CurrAlignment == 0)
        {
            VERIFY(m_ReservedSize == 0, "This is expected to be a very first time the space is added");
            m_CurrAlignment = sizeof(void*);
        }

        if (alignment > m_CurrAlignment)
        {
            // Reserve extra space that may be needed for alignment
            m_ReservedSize += alignment - m_CurrAlignment;
        }
        m_CurrAlignment = alignment;

        size = AlignUp(size, alignment);
        m_ReservedSize += size;

#if DILIGENT_DEBUG
        m_DbgAllocations.emplace_back(size, alignment, m_ReservedSize);
#endif
    }